

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddUtil.c
# Opt level: O1

int Cudd_zddNextPath(DdGen *gen,int **path)

{
  uint uVar1;
  int iVar2;
  DdManager *pDVar3;
  int *piVar4;
  DdNode **ppDVar5;
  int iVar6;
  uint *puVar7;
  DdNode *pDVar8;
  DdNode *pDVar9;
  
  iVar6 = (gen->stack).sp;
  if (iVar6 != 1) {
    pDVar3 = gen->manager;
    ppDVar5 = (gen->stack).stack;
    do {
      puVar7 = (uint *)((ulong)ppDVar5[(long)iVar6 + -2] & 0xfffffffffffffffe);
      pDVar9 = *(DdNode **)(puVar7 + 4);
      if (pDVar9 != ppDVar5[(long)iVar6 + -1]) {
        (gen->gen).cubes.cube[*puVar7] = 1;
        while( true ) {
          ppDVar5[(long)(gen->stack).sp + -1] = pDVar9;
          while( true ) {
            ppDVar5 = (gen->stack).stack;
            pDVar8 = ppDVar5[(long)(gen->stack).sp + -1];
            pDVar9 = (DdNode *)((ulong)pDVar8 & 0xfffffffffffffffe);
            if ((ulong)pDVar9->index == 0x7fffffff) break;
            (gen->gen).cubes.cube[pDVar9->index] = 0;
            iVar6 = (gen->stack).sp;
            ppDVar5[iVar6] = (DdNode *)((ulong)(pDVar9->type).kids.E ^ 1);
            (gen->stack).sp = iVar6 + 1;
          }
          if (pDVar3->zero != pDVar9) break;
          iVar6 = (gen->stack).sp;
          while( true ) {
            if (iVar6 == 1) {
              gen->status = 0;
              (gen->stack).sp = 0;
              goto LAB_0091e152;
            }
            pDVar9 = *(DdNode **)
                      ((uint *)((ulong)ppDVar5[(long)iVar6 + -2] & 0xfffffffffffffffe) + 4);
            piVar4 = (gen->gen).cubes.cube;
            uVar1 = *(uint *)((ulong)ppDVar5[(long)iVar6 + -2] & 0xfffffffffffffffe);
            if (pDVar9 != pDVar8) break;
            piVar4[uVar1] = 2;
            iVar2 = (gen->stack).sp;
            iVar6 = iVar2 + -1;
            (gen->stack).sp = iVar6;
            pDVar8 = ppDVar5[(long)iVar2 + -2];
          }
          piVar4[uVar1] = 1;
        }
        gen->status = 1;
        (gen->gen).cubes.value = (pDVar9->type).value;
        goto LAB_0091e152;
      }
      (gen->gen).cubes.cube[*puVar7] = 2;
      iVar6 = (gen->stack).sp + -1;
      (gen->stack).sp = iVar6;
    } while (iVar6 != 1);
  }
  gen->status = 0;
  (gen->stack).sp = iVar6 + -1;
LAB_0091e152:
  if (gen->status != 0) {
    *path = (gen->gen).cubes.cube;
    return 1;
  }
  return 0;
}

Assistant:

int
Cudd_zddNextPath(
  DdGen * gen,
  int ** path)
{
    DdNode *top, *next, *prev;
    DdManager *zdd = gen->manager;

    /* Backtrack from previously reached terminal node. */
    while (1) {
        if (gen->stack.sp == 1) {
            /* The current node has no predecessor. */
            gen->status = CUDD_GEN_EMPTY;
            gen->stack.sp--;
            goto done;
        }
        top = gen->stack.stack[gen->stack.sp-1];
        prev = Cudd_Regular(gen->stack.stack[gen->stack.sp-2]);
        next = cuddT(prev);
        if (next != top) { /* follow the then branch next */
            gen->gen.cubes.cube[prev->index] = 1;
            gen->stack.stack[gen->stack.sp-1] = next;
            break;
        }
        /* Pop the stack and try again. */
        gen->gen.cubes.cube[prev->index] = 2;
        gen->stack.sp--;
    }

    while (1) {
        top = gen->stack.stack[gen->stack.sp-1];
        if (!cuddIsConstant(Cudd_Regular(top))) {
            /* Take the else branch first. */
            gen->gen.cubes.cube[Cudd_Regular(top)->index] = 0;
            next = cuddE(Cudd_Regular(top));
            gen->stack.stack[gen->stack.sp] = Cudd_Not(next); gen->stack.sp++;
        } else if (Cudd_Regular(top) == DD_ZERO(zdd)) {
            /* Backtrack. */
            while (1) {
                if (gen->stack.sp == 1) {
                    /* The current node has no predecessor. */
                    gen->status = CUDD_GEN_EMPTY;
                    gen->stack.sp--;
                    goto done;
                }
                prev = Cudd_Regular(gen->stack.stack[gen->stack.sp-2]);
                next = cuddT(prev);
                if (next != top) { /* follow the then branch next */
                    gen->gen.cubes.cube[prev->index] = 1;
                    gen->stack.stack[gen->stack.sp-1] = next;
                    break;
                }
                /* Pop the stack and try again. */
                gen->gen.cubes.cube[prev->index] = 2;
                gen->stack.sp--;
                top = gen->stack.stack[gen->stack.sp-1];
            }
        } else {
            gen->status = CUDD_GEN_NONEMPTY;
            gen->gen.cubes.value = cuddV(Cudd_Regular(top));
            goto done;
        }
    }

done:
    if (gen->status == CUDD_GEN_EMPTY) return(0);
    *path = gen->gen.cubes.cube;
    return(1);

}